

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

void AddThumb1SBit(MCInst *MI,_Bool InITBlock)

{
  byte bVar1;
  MCOperandInfo *pMVar2;
  _Bool _Var3;
  uint uVar4;
  MCOperand *pMVar5;
  byte in_SIL;
  MCInst *in_RDI;
  uint i;
  unsigned_short NumOps;
  MCOperandInfo *OpInfo;
  uint local_20;
  
  uVar4 = MCInst_getOpcode(in_RDI);
  pMVar2 = ARMInsts[uVar4].OpInfo;
  uVar4 = MCInst_getOpcode(in_RDI);
  bVar1 = ARMInsts[uVar4].NumOperands;
  local_20 = 0;
  while( true ) {
    if ((bVar1 <= local_20) || (uVar4 = MCInst_getNumOperands(in_RDI), local_20 == uVar4)) {
      uVar4 = 3;
      if ((in_SIL & 1) != 0) {
        uVar4 = 0;
      }
      pMVar5 = MCOperand_CreateReg1(in_RDI,uVar4);
      MCInst_insert0(in_RDI,local_20,pMVar5);
      return;
    }
    _Var3 = MCOperandInfo_isOptionalDef(pMVar2 + local_20);
    if (((_Var3) && (pMVar2[local_20].RegClass == 0xc)) &&
       ((local_20 == 0 || (_Var3 = MCOperandInfo_isPredicate(pMVar2 + (local_20 - 1)), !_Var3))))
    break;
    local_20 = local_20 + 1;
  }
  uVar4 = 3;
  if ((in_SIL & 1) != 0) {
    uVar4 = 0;
  }
  pMVar5 = MCOperand_CreateReg1(in_RDI,uVar4);
  MCInst_insert0(in_RDI,local_20,pMVar5);
  return;
}

Assistant:

static void AddThumb1SBit(MCInst *MI, bool InITBlock)
{
	const MCOperandInfo *OpInfo = ARMInsts[MCInst_getOpcode(MI)].OpInfo;
	unsigned short NumOps = ARMInsts[MCInst_getOpcode(MI)].NumOperands;
	unsigned i;

	for (i = 0; i < NumOps; ++i) {
		if (i == MCInst_getNumOperands(MI)) break;
		if (MCOperandInfo_isOptionalDef(&OpInfo[i]) && OpInfo[i].RegClass == ARM_CCRRegClassID) {
			if (i > 0 && MCOperandInfo_isPredicate(&OpInfo[i-1])) continue;
			MCInst_insert0(MI, i, MCOperand_CreateReg1(MI, InITBlock ? 0 : ARM_CPSR));
			return;
		}
	}

	//MI.insert(I, MCOperand_CreateReg0(Inst, InITBlock ? 0 : ARM_CPSR));
	MCInst_insert0(MI, i, MCOperand_CreateReg1(MI, InITBlock ? 0 : ARM_CPSR));
}